

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::UniformTypes::Run(UniformTypes *this)

{
  size_t sVar1;
  GLuint GVar2;
  uint uVar3;
  char *src_vs;
  char *src_fs;
  mapped_type *pmVar4;
  CallLogWrapper *this_00;
  allocator<char> local_fb9;
  key_type local_fb8;
  undefined4 local_f98;
  undefined4 local_f94;
  GLint expected14 [16];
  allocator<char> local_f49;
  key_type local_f48;
  undefined4 local_f28;
  undefined4 local_f24;
  GLint expected13 [16];
  allocator<char> local_ed9;
  key_type local_ed8;
  undefined4 local_eb8;
  undefined4 local_eb4;
  GLint expected12 [16];
  allocator<char> local_e69;
  key_type local_e68;
  undefined4 local_e48;
  undefined4 local_e44;
  GLint expected11 [16];
  allocator<char> local_df9;
  key_type local_df8;
  undefined4 local_dd8;
  undefined4 local_dd4;
  GLint expected10 [16];
  allocator<char> local_d89;
  key_type local_d88;
  undefined4 local_d68;
  undefined4 local_d64;
  GLint expected9 [16];
  allocator<char> local_d19;
  key_type local_d18;
  undefined4 local_cf8;
  undefined4 local_cf4;
  GLint expected8 [16];
  allocator<char> local_ca9;
  key_type local_ca8;
  undefined4 local_c88;
  undefined4 local_c84;
  GLint expected7 [16];
  allocator<char> local_c39;
  key_type local_c38;
  undefined4 local_c18;
  undefined4 local_c14;
  GLint expected6 [16];
  allocator<char> local_bc9;
  key_type local_bc8;
  undefined4 local_ba8;
  undefined4 local_ba4;
  GLint expected5 [16];
  allocator<char> local_b59;
  key_type local_b58;
  undefined4 local_b38;
  undefined4 local_b34;
  GLint expected4 [16];
  allocator<char> local_ae9;
  key_type local_ae8;
  undefined4 local_ac8;
  undefined4 local_ac4;
  GLint expected3 [16];
  allocator<char> local_a79;
  key_type local_a78;
  undefined4 local_a58;
  undefined4 local_a54;
  GLint expected2 [16];
  allocator<char> local_a09;
  key_type local_a08;
  undefined4 local_9e8;
  undefined4 local_9e4;
  GLint expected [16];
  GLenum props [16];
  allocator<char> local_959;
  string local_958 [39];
  allocator<char> local_931;
  string local_930 [39];
  allocator<char> local_909;
  string local_908 [39];
  allocator<char> local_8e1;
  string local_8e0 [39];
  allocator<char> local_8b9;
  string local_8b8 [39];
  allocator<char> local_891;
  string local_890 [39];
  allocator<char> local_869;
  string local_868 [39];
  allocator<char> local_841;
  string local_840 [39];
  allocator<char> local_819;
  string local_818 [39];
  allocator<char> local_7f1;
  string local_7f0 [39];
  allocator<char> local_7c9;
  string local_7c8 [39];
  allocator<char> local_7a1;
  string local_7a0 [39];
  allocator<char> local_779;
  string local_778 [39];
  allocator<char> local_751;
  string local_750 [39];
  allocator<char> local_729;
  string local_728 [39];
  allocator<char> local_701;
  key_type local_700;
  allocator<char> local_6d9;
  string local_6d8 [39];
  allocator<char> local_6b1;
  key_type local_6b0;
  allocator<char> local_689;
  string local_688 [39];
  allocator<char> local_661;
  key_type local_660;
  allocator<char> local_639;
  string local_638 [39];
  allocator<char> local_611;
  key_type local_610;
  allocator<char> local_5e9;
  string local_5e8 [39];
  allocator<char> local_5c1;
  key_type local_5c0;
  allocator<char> local_599;
  string local_598 [39];
  allocator<char> local_571;
  key_type local_570;
  allocator<char> local_549;
  string local_548 [39];
  allocator<char> local_521;
  key_type local_520;
  allocator<char> local_4f9;
  string local_4f8 [39];
  allocator<char> local_4d1;
  key_type local_4d0;
  allocator<char> local_4a9;
  string local_4a8 [39];
  allocator<char> local_481;
  key_type local_480;
  allocator<char> local_459;
  string local_458 [39];
  allocator<char> local_431;
  key_type local_430;
  allocator<char> local_409;
  string local_408 [39];
  allocator<char> local_3e1;
  key_type local_3e0;
  allocator<char> local_3b9;
  string local_3b8 [39];
  allocator<char> local_391;
  key_type local_390;
  allocator<char> local_369;
  string local_368 [39];
  allocator<char> local_341;
  key_type local_340;
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  key_type local_2f0;
  allocator<char> local_2c9;
  string local_2c8 [39];
  allocator<char> local_2a1;
  string local_2a0 [39];
  allocator<char> local_279;
  string local_278 [39];
  allocator<char> local_251;
  string local_250 [39];
  allocator<char> local_229;
  string local_228 [39];
  allocator<char> local_201;
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [32];
  undefined1 local_a0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indices;
  long error;
  string local_58 [32];
  string local_38 [36];
  GLuint local_14;
  UniformTypes *pUStack_10;
  GLuint program;
  UniformTypes *this_local;
  
  pUStack_10 = this;
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x16])();
  src_vs = (char *)std::__cxx11::string::c_str();
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x17])(local_58);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar2 = PIQBase::CreateProgram(&this->super_PIQBase,src_vs,src_fs,false);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  this_00 = &(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  local_14 = GVar2;
  glu::CallLogWrapper::glBindAttribLocation(this_00,GVar2,0,"position");
  glu::CallLogWrapper::glBindFragDataLocation(this_00,local_14,0,"color");
  PIQBase::LinkProgram(&this->super_PIQBase,local_14);
  GVar2 = local_14;
  indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar3 = (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x15])
                    (this,(ulong)local_14,0x8b86);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)GVar2,0x92e1,0x92f5,(ulong)uVar3);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)local_14,0x92e1,0x92f6,0xf,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)local_a0);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"a",&local_c1);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)GVar2,0x92e1,local_a0,local_c0,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"b",&local_e9);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)GVar2,0x92e1,local_a0,local_e8,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_110,"c",&local_111);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)GVar2,0x92e1,local_a0,local_110,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_138,"d",&local_139);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)GVar2,0x92e1,local_a0,local_138,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_160,"e",&local_161);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)GVar2,0x92e1,local_a0,local_160,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188,"f",&local_189);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)GVar2,0x92e1,local_a0,local_188,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"g",&local_1b1);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)GVar2,0x92e1,local_a0,local_1b0,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"h",&local_1d9);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)GVar2,0x92e1,local_a0,local_1d8,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_200,"i",&local_201);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)GVar2,0x92e1,local_a0,local_200,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_228,"j.b",&local_229);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)GVar2,0x92e1,local_a0,local_228,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator(&local_229);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_250,"k.b[0].c",&local_251);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)GVar2,0x92e1,local_a0,local_250,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator(&local_251);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_278,"l[0].c",&local_279);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)GVar2,0x92e1,local_a0,local_278,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator(&local_279);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"l[2].b[1].d[0]",&local_2a1);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)GVar2,0x92e1,local_a0,local_2a0,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2c8,"l[2].a.c",&local_2c9);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)GVar2,0x92e1,local_a0,local_2c8,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"a",&local_2f1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_2f0);
  uVar3 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_318,"a",&local_319);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)GVar2,0x92e1,(ulong)uVar3,local_318,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_319);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"b",&local_341);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_340);
  uVar3 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_368,"b",&local_369);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)GVar2,0x92e1,(ulong)uVar3,local_368,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator(&local_369);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"c",&local_391);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_390);
  uVar3 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3b8,"c[0]",&local_3b9);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)GVar2,0x92e1,(ulong)uVar3,local_3b8,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"d",&local_3e1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_3e0);
  uVar3 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_408,"d",&local_409);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)GVar2,0x92e1,(ulong)uVar3,local_408,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator(&local_409);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"e",&local_431);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_430);
  uVar3 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_458,"e",&local_459);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)GVar2,0x92e1,(ulong)uVar3,local_458,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator(&local_459);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"f",&local_481);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_480);
  uVar3 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4a8,"f",&local_4a9);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)GVar2,0x92e1,(ulong)uVar3,local_4a8,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator(&local_481);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"g",&local_4d1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_4d0);
  uVar3 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4f8,"g[0]",&local_4f9);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)GVar2,0x92e1,(ulong)uVar3,local_4f8,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"h",&local_521);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_520);
  uVar3 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_548,"h",&local_549);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)GVar2,0x92e1,(ulong)uVar3,local_548,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator(&local_549);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"i",&local_571);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_570);
  uVar3 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_598,"i",&local_599);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)GVar2,0x92e1,(ulong)uVar3,local_598,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator(&local_599);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c0,"j.b",&local_5c1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_5c0);
  uVar3 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5e8,"j.b",&local_5e9);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)GVar2,0x92e1,(ulong)uVar3,local_5e8,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator(&local_5e9);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator(&local_5c1);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_610,"k.b[0].c",&local_611);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_610);
  uVar3 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_638,"k.b[0].c",&local_639);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)GVar2,0x92e1,(ulong)uVar3,local_638,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator(&local_639);
  std::__cxx11::string::~string((string *)&local_610);
  std::allocator<char>::~allocator(&local_611);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,"l[0].c",&local_661);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_660);
  uVar3 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_688,"l[0].c",&local_689);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)GVar2,0x92e1,(ulong)uVar3,local_688,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_688);
  std::allocator<char>::~allocator(&local_689);
  std::__cxx11::string::~string((string *)&local_660);
  std::allocator<char>::~allocator(&local_661);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,"l[2].b[1].d[0]",&local_6b1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_6b0);
  uVar3 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6d8,"l[2].b[1].d[0]",&local_6d9);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)GVar2,0x92e1,(ulong)uVar3,local_6d8,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::allocator<char>::~allocator(&local_6b1);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,"l[2].a.c",&local_701);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_700);
  uVar3 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_728,"l[2].a.c",&local_729);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)GVar2,0x92e1,(ulong)uVar3,local_728,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_728);
  std::allocator<char>::~allocator(&local_729);
  std::__cxx11::string::~string((string *)&local_700);
  std::allocator<char>::~allocator(&local_701);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_750,"a",&local_751);
  uVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                     local_14,"a");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)GVar2,0x92e1,local_750,(ulong)uVar3,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_750);
  std::allocator<char>::~allocator(&local_751);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_778,"b",&local_779);
  uVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                     local_14,"b");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)GVar2,0x92e1,local_778,(ulong)uVar3,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_778);
  std::allocator<char>::~allocator(&local_779);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7a0,"c",&local_7a1);
  uVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                     local_14,"c");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)GVar2,0x92e1,local_7a0,(ulong)uVar3,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_7a0);
  std::allocator<char>::~allocator(&local_7a1);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7c8,"d",&local_7c9);
  uVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                     local_14,"d");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)GVar2,0x92e1,local_7c8,(ulong)uVar3,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_7c8);
  std::allocator<char>::~allocator(&local_7c9);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7f0,"e",&local_7f1);
  uVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                     local_14,"e");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)GVar2,0x92e1,local_7f0,(ulong)uVar3,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_7f0);
  std::allocator<char>::~allocator(&local_7f1);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_818,"f",&local_819);
  uVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                     local_14,"f");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)GVar2,0x92e1,local_818,(ulong)uVar3,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator(&local_819);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_840,"g",&local_841);
  uVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                     local_14,"g");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)GVar2,0x92e1,local_840,(ulong)uVar3,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_840);
  std::allocator<char>::~allocator(&local_841);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_868,"h",&local_869);
  uVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                     local_14,"h");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)GVar2,0x92e1,local_868,(ulong)uVar3,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_868);
  std::allocator<char>::~allocator(&local_869);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_890,"i",&local_891);
  uVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                     local_14,"i");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)GVar2,0x92e1,local_890,(ulong)uVar3,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_890);
  std::allocator<char>::~allocator(&local_891);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8b8,"j.b",&local_8b9);
  uVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                     local_14,"j.b");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)GVar2,0x92e1,local_8b8,(ulong)uVar3,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_8b8);
  std::allocator<char>::~allocator(&local_8b9);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8e0,"k.b[0].c",&local_8e1);
  uVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                     local_14,"k.b[0].c");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)GVar2,0x92e1,local_8e0,(ulong)uVar3,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_8e0);
  std::allocator<char>::~allocator(&local_8e1);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_908,"l[0].c",&local_909);
  uVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                     local_14,"l[0].c");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)GVar2,0x92e1,local_908,(ulong)uVar3,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_908);
  std::allocator<char>::~allocator(&local_909);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_930,"l[2].b[1].d[0]",&local_931);
  uVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                     local_14,"l[2].b[1].d[0]");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)GVar2,0x92e1,local_930,(ulong)uVar3,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_930);
  std::allocator<char>::~allocator(&local_931);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_958,"l[2].a.c",&local_959);
  uVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                     local_14,"l[2].a.c");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)GVar2,0x92e1,local_958,(ulong)uVar3,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_958);
  std::allocator<char>::~allocator(&local_959);
  expected[0xe] = 0x92f9;
  expected[0xf] = 0x92fa;
  local_9e8 = 2;
  local_9e4 = 0x8b52;
  expected[0] = 1;
  expected[1] = -1;
  expected[2] = -1;
  expected[3] = -1;
  expected[4] = -1;
  expected[5] = 0;
  expected[6] = -1;
  expected[7] = 0;
  expected[8] = 0;
  expected[9] = 0;
  expected[10] = 0;
  expected[0xb] = 0;
  expected[0xc] = 1;
  expected[0xd] =
       glu::CallLogWrapper::glGetUniformLocation
                 (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                  local_14,"a");
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a08,"a",&local_a09);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_a08);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)GVar2,0x92e1,(ulong)*pmVar4,0x10,expected + 0xe,0x10,&local_9e8,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_a08);
  std::allocator<char>::~allocator(&local_a09);
  local_a58 = 2;
  local_a54 = 0x8b54;
  expected2[0] = 1;
  expected2[1] = -1;
  expected2[2] = -1;
  expected2[3] = -1;
  expected2[4] = -1;
  expected2[5] = 0;
  expected2[6] = -1;
  expected2[7] = 0;
  expected2[8] = 0;
  expected2[9] = 0;
  expected2[10] = 0;
  expected2[0xb] = 0;
  expected2[0xc] = 1;
  expected2[0xd] =
       glu::CallLogWrapper::glGetUniformLocation
                 (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                  local_14,"b");
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a78,"b",&local_a79);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_a78);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)GVar2,0x92e1,(ulong)*pmVar4,0x10,expected + 0xe,0x10,&local_a58,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_a78);
  std::allocator<char>::~allocator(&local_a79);
  local_ac8 = 5;
  local_ac4 = 0x8dc6;
  expected3[0] = 3;
  expected3[1] = -1;
  expected3[2] = -1;
  expected3[3] = -1;
  expected3[4] = -1;
  expected3[5] = 0;
  expected3[6] = -1;
  expected3[7] = 0;
  expected3[8] = 0;
  expected3[9] = 0;
  expected3[10] = 0;
  expected3[0xb] = 0;
  expected3[0xc] = 1;
  expected3[0xd] =
       glu::CallLogWrapper::glGetUniformLocation
                 (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                  local_14,"c");
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae8,"c",&local_ae9);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_ae8);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)GVar2,0x92e1,(ulong)*pmVar4,0x10,expected + 0xe,0x10,&local_ac8,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_ae8);
  std::allocator<char>::~allocator(&local_ae9);
  local_b38 = 2;
  local_b34 = 0x8b5c;
  expected4[0] = 1;
  expected4[1] = -1;
  expected4[2] = -1;
  expected4[3] = -1;
  expected4[4] = -1;
  expected4[5] = 0;
  expected4[6] = -1;
  expected4[7] = 0;
  expected4[8] = 1;
  expected4[9] = 0;
  expected4[10] = 0;
  expected4[0xb] = 0;
  expected4[0xc] = 0;
  expected4[0xd] =
       glu::CallLogWrapper::glGetUniformLocation
                 (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                  local_14,"d");
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b58,"d",&local_b59);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_b58);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)GVar2,0x92e1,(ulong)*pmVar4,0x10,expected + 0xe,0x10,&local_b38,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_b58);
  std::allocator<char>::~allocator(&local_b59);
  local_ba8 = 2;
  local_ba4 = 0x8b5b;
  expected5[0] = 1;
  expected5[1] = -1;
  expected5[2] = -1;
  expected5[3] = -1;
  expected5[4] = -1;
  expected5[5] = 0;
  expected5[6] = -1;
  expected5[7] = 0;
  expected5[8] = 1;
  expected5[9] = 0;
  expected5[10] = 0;
  expected5[0xb] = 0;
  expected5[0xc] = 0;
  expected5[0xd] =
       glu::CallLogWrapper::glGetUniformLocation
                 (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                  local_14,"e");
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_bc8,"e",&local_bc9);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_bc8);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)GVar2,0x92e1,(ulong)*pmVar4,0x10,expected + 0xe,0x10,&local_ba8,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_bc8);
  std::allocator<char>::~allocator(&local_bc9);
  local_c18 = 2;
  local_c14 = 0x1404;
  expected6[0] = 1;
  expected6[1] = -1;
  expected6[2] = -1;
  expected6[3] = -1;
  expected6[4] = -1;
  expected6[5] = 0;
  expected6[6] = -1;
  expected6[7] = 0;
  expected6[8] = 1;
  expected6[9] = 0;
  expected6[10] = 0;
  expected6[0xb] = 0;
  expected6[0xc] = 0;
  expected6[0xd] =
       glu::CallLogWrapper::glGetUniformLocation
                 (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                  local_14,"f");
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c38,"f",&local_c39);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_c38);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)GVar2,0x92e1,(ulong)*pmVar4,0x10,expected + 0xe,0x10,&local_c18,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_c38);
  std::allocator<char>::~allocator(&local_c39);
  local_c88 = 5;
  local_c84 = 0x8b5a;
  expected7[0] = 8;
  expected7[1] = -1;
  expected7[2] = -1;
  expected7[3] = -1;
  expected7[4] = -1;
  expected7[5] = 0;
  expected7[6] = -1;
  expected7[7] = 0;
  expected7[8] = 0;
  expected7[9] = 0;
  expected7[10] = 0;
  expected7[0xb] = 0;
  expected7[0xc] = 1;
  expected7[0xd] =
       glu::CallLogWrapper::glGetUniformLocation
                 (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                  local_14,"g");
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ca8,"g",&local_ca9);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_ca8);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)GVar2,0x92e1,(ulong)*pmVar4,0x10,expected + 0xe,0x10,&local_c88,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_ca8);
  std::allocator<char>::~allocator(&local_ca9);
  local_cf8 = 2;
  local_cf4 = 0x1406;
  expected8[0] = 1;
  expected8[1] = -1;
  expected8[2] = -1;
  expected8[3] = -1;
  expected8[4] = -1;
  expected8[5] = 0;
  expected8[6] = -1;
  expected8[7] = 0;
  expected8[8] = 1;
  expected8[9] = 0;
  expected8[10] = 0;
  expected8[0xb] = 0;
  expected8[0xc] = 0;
  expected8[0xd] =
       glu::CallLogWrapper::glGetUniformLocation
                 (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                  local_14,"h");
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d18,"h",&local_d19);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_d18);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)GVar2,0x92e1,(ulong)*pmVar4,0x10,expected + 0xe,0x10,&local_cf8,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_d18);
  std::allocator<char>::~allocator(&local_d19);
  local_d68 = 2;
  local_d64 = 0x8b67;
  expected9[0] = 1;
  expected9[1] = -1;
  expected9[2] = -1;
  expected9[3] = -1;
  expected9[4] = -1;
  expected9[5] = 0;
  expected9[6] = -1;
  expected9[7] = 0;
  expected9[8] = 0;
  expected9[9] = 0;
  expected9[10] = 0;
  expected9[0xb] = 0;
  expected9[0xc] = 1;
  expected9[0xd] =
       glu::CallLogWrapper::glGetUniformLocation
                 (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                  local_14,"i");
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d88,"i",&local_d89);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_d88);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)GVar2,0x92e1,(ulong)*pmVar4,0x10,expected + 0xe,0x10,&local_d68,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_d88);
  std::allocator<char>::~allocator(&local_d89);
  local_dd8 = 4;
  local_dd4 = 0x8b52;
  expected10[0] = 1;
  expected10[1] = -1;
  expected10[2] = -1;
  expected10[3] = -1;
  expected10[4] = -1;
  expected10[5] = 0;
  expected10[6] = -1;
  expected10[7] = 0;
  expected10[8] = 1;
  expected10[9] = 0;
  expected10[10] = 0;
  expected10[0xb] = 0;
  expected10[0xc] = 0;
  expected10[0xd] =
       glu::CallLogWrapper::glGetUniformLocation
                 (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                  local_14,"j.b");
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_df8,"j.b",&local_df9);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_df8);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)GVar2,0x92e1,(ulong)*pmVar4,0x10,expected + 0xe,0x10,&local_dd8,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_df8);
  std::allocator<char>::~allocator(&local_df9);
  local_e48 = 9;
  local_e44 = 0x8b5b;
  expected11[0] = 1;
  expected11[1] = -1;
  expected11[2] = -1;
  expected11[3] = -1;
  expected11[4] = -1;
  expected11[5] = 0;
  expected11[6] = -1;
  expected11[7] = 0;
  expected11[8] = 1;
  expected11[9] = 0;
  expected11[10] = 0;
  expected11[0xb] = 0;
  expected11[0xc] = 0;
  expected11[0xd] =
       glu::CallLogWrapper::glGetUniformLocation
                 (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                  local_14,"k.b[0].c");
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e68,"k.b[0].c",&local_e69);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_e68);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)GVar2,0x92e1,(ulong)*pmVar4,0x10,expected + 0xe,0x10,&local_e48,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_e68);
  std::allocator<char>::~allocator(&local_e69);
  local_eb8 = 7;
  local_eb4 = 0x8dc6;
  expected12[0] = 1;
  expected12[1] = -1;
  expected12[2] = -1;
  expected12[3] = -1;
  expected12[4] = -1;
  expected12[5] = 0;
  expected12[6] = -1;
  expected12[7] = 0;
  expected12[8] = 1;
  expected12[9] = 0;
  expected12[10] = 0;
  expected12[0xb] = 0;
  expected12[0xc] = 0;
  expected12[0xd] =
       glu::CallLogWrapper::glGetUniformLocation
                 (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                  local_14,"l[0].c");
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ed8,"l[0].c",&local_ed9);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_ed8);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)GVar2,0x92e1,(ulong)*pmVar4,0x10,expected + 0xe,0x10,&local_eb8,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_ed8);
  std::allocator<char>::~allocator(&local_ed9);
  local_f28 = 0xf;
  local_f24 = 0x1406;
  expected13[0] = 2;
  expected13[1] = -1;
  expected13[2] = -1;
  expected13[3] = -1;
  expected13[4] = -1;
  expected13[5] = 0;
  expected13[6] = -1;
  expected13[7] = 0;
  expected13[8] = 1;
  expected13[9] = 0;
  expected13[10] = 0;
  expected13[0xb] = 0;
  expected13[0xc] = 0;
  expected13[0xd] =
       glu::CallLogWrapper::glGetUniformLocation
                 (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                  local_14,"l[2].b[1].d[0]");
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f48,"l[2].b[1].d[0]",&local_f49);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_f48);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)GVar2,0x92e1,(ulong)*pmVar4,0x10,expected + 0xe,0x10,&local_f28,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_f48);
  std::allocator<char>::~allocator(&local_f49);
  local_f98 = 9;
  local_f94 = 0x8b5b;
  expected14[0] = 1;
  expected14[1] = -1;
  expected14[2] = -1;
  expected14[3] = -1;
  expected14[4] = -1;
  expected14[5] = 0;
  expected14[6] = -1;
  expected14[7] = 0;
  expected14[8] = 1;
  expected14[9] = 0;
  expected14[10] = 0;
  expected14[0xb] = 0;
  expected14[0xc] = 0;
  expected14[0xd] =
       glu::CallLogWrapper::glGetUniformLocation
                 (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                  local_14,"l[2].a.c");
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_fb8,"l[2].a.c",&local_fb9);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_fb8);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)GVar2,0x92e1,(ulong)*pmVar4,0x10,expected + 0xe,0x10,&local_f98,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_fb8);
  std::allocator<char>::~allocator(&local_fb9);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,local_14)
  ;
  sVar1 = indices._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)local_a0);
  return sVar1;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);

		long error = NO_ERROR;

		// only active structure members
		VerifyGetProgramInterfaceiv(program, GL_UNIFORM, GL_ACTIVE_RESOURCES,
									GetProgramivRetValue(program, GL_ACTIVE_UNIFORMS), error);
		// l[2].b[1].d[0] and \0
		VerifyGetProgramInterfaceiv(program, GL_UNIFORM, GL_MAX_NAME_LENGTH, 15, error);

		std::map<std::string, GLuint> indices;
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "a", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "b", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "c", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "d", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "e", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "f", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "g", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "h", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "i", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "j.b", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "k.b[0].c", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "l[0].c", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "l[2].b[1].d[0]", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "l[2].a.c", error);

		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["a"], "a", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["b"], "b", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["c"], "c[0]", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["d"], "d", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["e"], "e", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["f"], "f", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["g"], "g[0]", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["h"], "h", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["i"], "i", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["j.b"], "j.b", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["k.b[0].c"], "k.b[0].c", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["l[0].c"], "l[0].c", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["l[2].b[1].d[0]"], "l[2].b[1].d[0]", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["l[2].a.c"], "l[2].a.c", error);

		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a", glGetUniformLocation(program, "a"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "b", glGetUniformLocation(program, "b"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "c", glGetUniformLocation(program, "c"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d", glGetUniformLocation(program, "d"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "e", glGetUniformLocation(program, "e"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "f", glGetUniformLocation(program, "f"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "g", glGetUniformLocation(program, "g"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "h", glGetUniformLocation(program, "h"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "i", glGetUniformLocation(program, "i"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "j.b", glGetUniformLocation(program, "j.b"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "k.b[0].c", glGetUniformLocation(program, "k.b[0].c"),
										 error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "l[0].c", glGetUniformLocation(program, "l[0].c"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "l[2].b[1].d[0]",
										 glGetUniformLocation(program, "l[2].b[1].d[0]"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "l[2].a.c", glGetUniformLocation(program, "l[2].a.c"),
										 error);

		GLenum props[] = { GL_NAME_LENGTH,
						   GL_TYPE,
						   GL_ARRAY_SIZE,
						   GL_OFFSET,
						   GL_BLOCK_INDEX,
						   GL_ARRAY_STRIDE,
						   GL_MATRIX_STRIDE,
						   GL_IS_ROW_MAJOR,
						   GL_ATOMIC_COUNTER_BUFFER_INDEX,
						   GL_REFERENCED_BY_COMPUTE_SHADER,
						   GL_REFERENCED_BY_FRAGMENT_SHADER,
						   GL_REFERENCED_BY_GEOMETRY_SHADER,
						   GL_REFERENCED_BY_TESS_CONTROL_SHADER,
						   GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
						   GL_REFERENCED_BY_VERTEX_SHADER,
						   GL_LOCATION };
		GLint expected[] = {
			2, GL_FLOAT_VEC4, 1, -1, -1, -1, -1, 0, -1, 0, 0, 0, 0, 0, 1, glGetUniformLocation(program, "a")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["a"], 16, props, 16, expected, error);
		GLint expected2[] = { 2,  GL_INT_VEC3, 1, -1, -1, -1, -1, 0,
							  -1, 0,		   0, 0,  0,  0,  1,  glGetUniformLocation(program, "b") };
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["b"], 16, props, 16, expected2, error);
		GLint expected3[] = {
			5, GL_UNSIGNED_INT_VEC2, 3, -1, -1, -1, -1, 0, -1, 0, 0, 0, 0, 0, 1, glGetUniformLocation(program, "c")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["c"], 16, props, 16, expected3, error);
		GLint expected4[] = {
			2, GL_FLOAT_MAT4, 1, -1, -1, -1, -1, 0, -1, 0, 1, 0, 0, 0, 0, glGetUniformLocation(program, "d")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["d"], 16, props, 16, expected4, error);
		GLint expected5[] = {
			2, GL_FLOAT_MAT3, 1, -1, -1, -1, -1, 0, -1, 0, 1, 0, 0, 0, 0, glGetUniformLocation(program, "e")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["e"], 16, props, 16, expected5, error);
		GLint expected6[] = {
			2, GL_INT, 1, -1, -1, -1, -1, 0, -1, 0, 1, 0, 0, 0, 0, glGetUniformLocation(program, "f")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["f"], 16, props, 16, expected6, error);
		GLint expected7[] = {
			5, GL_FLOAT_MAT2, 8, -1, -1, -1, -1, 0, -1, 0, 0, 0, 0, 0, 1, glGetUniformLocation(program, "g")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["g"], 16, props, 16, expected7, error);
		GLint expected8[] = { 2,  GL_FLOAT, 1, -1, -1, -1, -1, 0,
							  -1, 0,		1, 0,  0,  0,  0,  glGetUniformLocation(program, "h") };
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["h"], 16, props, 16, expected8, error);
		GLint expected9[] = {
			2, GL_FLOAT_MAT3x2, 1, -1, -1, -1, -1, 0, -1, 0, 0, 0, 0, 0, 1, glGetUniformLocation(program, "i")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["i"], 16, props, 16, expected9, error);
		GLint expected10[] = {
			4, GL_FLOAT_VEC4, 1, -1, -1, -1, -1, 0, -1, 0, 1, 0, 0, 0, 0, glGetUniformLocation(program, "j.b")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["j.b"], 16, props, 16, expected10, error);
		GLint expected11[] = {
			9, GL_FLOAT_MAT3, 1, -1, -1, -1, -1, 0, -1, 0, 1, 0, 0, 0, 0, glGetUniformLocation(program, "k.b[0].c")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["k.b[0].c"], 16, props, 16, expected11, error);
		GLint expected12[] = { 7,  GL_UNSIGNED_INT_VEC2,
							   1,  -1,
							   -1, -1,
							   -1, 0,
							   -1, 0,
							   1,  0,
							   0,  0,
							   0,  glGetUniformLocation(program, "l[0].c") };
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["l[0].c"], 16, props, 16, expected12, error);
		GLint expected13[] = { 15, GL_FLOAT, 2, -1, -1, -1, -1, 0,
							   -1, 0,		 1, 0,  0,  0,  0,  glGetUniformLocation(program, "l[2].b[1].d[0]") };
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["l[2].b[1].d[0]"], 16, props, 16, expected13, error);
		GLint expected14[] = {
			9, GL_FLOAT_MAT3, 1, -1, -1, -1, -1, 0, -1, 0, 1, 0, 0, 0, 0, glGetUniformLocation(program, "l[2].a.c")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["l[2].a.c"], 16, props, 16, expected14, error);

		glDeleteProgram(program);
		return error;
	}